

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionUtils.h
# Opt level: O1

void __thiscall ExpressionUtils::~ExpressionUtils(ExpressionUtils *this)

{
  pointer ppEVar1;
  
  ppEVar1 = (this->deathMap).super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  if (ppEVar1 !=
      (this->deathMap).super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      if (*ppEVar1 != (Expression *)0x0) {
        (*(*ppEVar1)->_vptr_Expression[4])();
      }
      ppEVar1 = ppEVar1 + 1;
    } while (ppEVar1 !=
             (this->deathMap).super__Vector_base<Expression_*,_std::allocator<Expression_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  ppEVar1 = (this->deathMap).super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  if (ppEVar1 != (pointer)0x0) {
    operator_delete(ppEVar1,(long)(this->deathMap).
                                  super__Vector_base<Expression_*,_std::allocator<Expression_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppEVar1)
    ;
    return;
  }
  return;
}

Assistant:

~ExpressionUtils(){
        auto it = this->deathMap.begin();
        while (it != this->deathMap.end()){
            delete *it;
            it++;
        }
    }